

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
::table_core(table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
             *this,size_t n,hash<const_slang::ast::Scope_*,_void> *h_,
            equal_to<const_slang::ast::Scope_*> *pred_,
            allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>
            *al_)

{
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  *this_00;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  empty_value<slang::hash<slang::ast::Scope_const*,void>,0u,true> *in_RDI;
  undefined8 in_R8;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  *ptVar2;
  size_t in_stack_ffffffffffffffc8;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  *in_stack_ffffffffffffffd0;
  
  empty_::empty_value<slang::hash<slang::ast::Scope_const*,void>,0u,true>::
  empty_value<slang::hash<slang::ast::Scope_const*,void>const&>(in_RDI,in_RDX);
  empty_::empty_value<std::equal_to<slang::ast::Scope_const*>,1u,true>::
  empty_value<std::equal_to<slang::ast::Scope_const*>const&>
            ((empty_value<std::equal_to<slang::ast::Scope_const*>,1u,true> *)in_RDI,in_RCX);
  empty_::
  empty_value<std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>,2u,true>
  ::
  empty_value<std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>const&>
            ((empty_value<std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>,_2U,_true>
              *)in_RDI,in_R8);
  new_arrays(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
             *)(in_RDI + 0x20);
  ptVar2 = this_00;
  sVar1 = initial_max_load(this_00);
  (this_00->arrays).groups_size_index = sVar1;
  (ptVar2->arrays).groups_size_mask = 0;
  return;
}

Assistant:

table_core(std::size_t n = default_bucket_count, const Hash& h_ = Hash(),
               const Pred& pred_ = Pred(), const Allocator& al_ = Allocator()) :
        hash_base{empty_init, h_}, pred_base{empty_init, pred_}, allocator_base{empty_init, al_},
        arrays(new_arrays(n)), size_ctrl{initial_max_load(), 0} {}